

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

Type * slang::ast::Type::fromSyntax
                 (Compilation *compilation,Type *elementType,
                 SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,ASTContext *context)

{
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> syntax;
  bool bVar1;
  DeferredSourceRange sourceRange;
  Type *pTVar2;
  Diagnostic *diag;
  size_t sVar3;
  SourceRange sourceRange_00;
  EvaluatedDimension dim;
  bool local_79;
  Compilation *local_78;
  Type *local_70;
  EvaluatedDimension local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  VariableDimensionSyntax *local_38;
  
  if ((dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
      _M_extent._M_extent_value != 0) {
    local_78 = compilation;
    pTVar2 = getCanonicalType(elementType);
    if (((pTVar2->super_Symbol).kind - UntypedType < 3) &&
       (((context->flags).m_bits & 0x80000000) == 0)) {
      sourceRange_00 =
           slang::syntax::SyntaxNode::sourceRange
                     (&(dimensions->super_SyntaxListBase).super_SyntaxNode);
      diag = ASTContext::addDiag(context,(DiagCode)0xb0009,sourceRange_00);
      ast::operator<<(diag,elementType);
      elementType = local_78->errorType;
    }
    else {
      sVar3 = (dimensions->
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
              _M_extent._M_extent_value;
      if (sVar3 != 0) {
        while (pTVar2 = getCanonicalType(elementType), (pTVar2->super_Symbol).kind != ErrorType) {
          syntax.value = (uintptr_t)
                         (dimensions->
                         super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                         )._M_ptr[sVar3 - 1];
          ASTContext::evalDimension
                    (&local_68,context,(VariableDimensionSyntax *)syntax.value,false,false);
          bVar1 = true;
          switch(local_68.kind) {
          case Unknown:
            local_70 = local_78->errorType;
            bVar1 = false;
            goto switchD_002ae0ff_default;
          case Range:
          case AbbreviatedRange:
            local_48 = 0;
            uStack_40 = 0;
            sourceRange.node.value = syntax.value;
            sourceRange.range = (SourceRange)ZEXT816(0);
            local_38 = (VariableDimensionSyntax *)syntax.value;
            elementType = FixedSizeUnpackedArrayType::fromDim
                                    ((context->scope).ptr,elementType,local_68.range,sourceRange);
            goto switchD_002ae0ff_default;
          case Dynamic:
            elementType = &BumpAllocator::
                           emplace<slang::ast::DynamicArrayType,slang::ast::Type_const&>
                                     (&local_78->super_BumpAllocator,elementType)->super_Type;
            break;
          case Associative:
            elementType = &BumpAllocator::
                           emplace<slang::ast::AssociativeArrayType,slang::ast::Type_const&,slang::ast::Type_const*&>
                                     (&local_78->super_BumpAllocator,elementType,
                                      &local_68.associativeType)->super_Type;
            break;
          case Queue:
            elementType = &BumpAllocator::
                           emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int&>
                                     (&local_78->super_BumpAllocator,elementType,
                                      &local_68.queueMaxSize)->super_Type;
            break;
          case DPIOpenArray:
            local_79 = false;
            elementType = &BumpAllocator::
                           emplace<slang::ast::DPIOpenArrayType,slang::ast::Type_const&,bool>
                                     (&local_78->super_BumpAllocator,elementType,&local_79)->
                           super_Type;
            break;
          default:
            goto switchD_002ae0ff_default;
          }
          (((AssociativeArrayType *)elementType)->super_Type).super_Symbol.originatingSyntax =
               (SyntaxNode *)syntax.value;
switchD_002ae0ff_default:
          if (!bVar1) {
            return local_70;
          }
          sVar3 = sVar3 - 1;
          if (sVar3 == 0) {
            return &((AssociativeArrayType *)elementType)->super_Type;
          }
        }
      }
    }
  }
  return &((AssociativeArrayType *)elementType)->super_Type;
}

Assistant:

const Type& Type::fromSyntax(Compilation& compilation, const Type& elementType,
                             const SyntaxList<VariableDimensionSyntax>& dimensions,
                             const ASTContext& context) {
    if (dimensions.empty())
        return elementType;

    switch (elementType.getCanonicalType().kind) {
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType:
        case SymbolKind::UntypedType:
            if (!context.flags.has(ASTFlags::AllowInterconnect)) {
                context.addDiag(diag::InvalidArrayElemType, dimensions.sourceRange())
                    << elementType;
                return compilation.getErrorType();
            }
            break;
        default:
            break;
    }

    const Type* result = &elementType;
    size_t count = dimensions.size();
    for (size_t i = 0; i < count; i++) {
        if (result->isError())
            return *result;

        auto& syntax = *dimensions[count - i - 1];
        auto dim = context.evalDimension(syntax, /* requireRange */ false, /* isPacked */ false);

        switch (dim.kind) {
            case DimensionKind::Unknown:
                return compilation.getErrorType();
            case DimensionKind::Range:
            case DimensionKind::AbbreviatedRange:
                result = &FixedSizeUnpackedArrayType::fromDim(*context.scope, *result, dim.range,
                                                              syntax);
                break;
            case DimensionKind::Dynamic: {
                auto next = compilation.emplace<DynamicArrayType>(*result);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::DPIOpenArray: {
                auto next = compilation.emplace<DPIOpenArrayType>(*result, /* isPacked */ false);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::Associative: {
                auto next = compilation.emplace<AssociativeArrayType>(*result, dim.associativeType);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::Queue: {
                auto next = compilation.emplace<QueueType>(*result, dim.queueMaxSize);
                next->setSyntax(syntax);
                result = next;
                break;
            }
        }
    }

    return *result;
}